

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

Publication * __thiscall
helics::ValueFederateManager::getPublication(ValueFederateManager *this,string_view key)

{
  Publication *pPVar1;
  BlockIterator<const_helics::Publication,_32,_const_helics::Publication_*const_*> pubF;
  shared_handle pubHandle;
  BlockIterator<const_helics::Publication,_32,_const_helics::Publication_*const_*> local_60;
  shared_handle local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock_shared(&local_48,&this->publications);
  gmlc::containers::
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>::
  find(&local_60,local_48.data,key);
  gmlc::containers::StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>
  ::end(&local_30,&(local_48.data)->dataStorage);
  pPVar1 = (Publication *)invalidPub;
  if (local_60.vec != local_30.vec) {
    pPVar1 = local_60.ptr;
  }
  if (local_60.offset != local_30.offset) {
    pPVar1 = local_60.ptr;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48.m_handle_lock);
  return pPVar1;
}

Assistant:

const Publication& ValueFederateManager::getPublication(std::string_view key) const
{
    auto pubHandle = publications.lock_shared();
    auto pubF = pubHandle->find(key);
    if (pubF != pubHandle->end()) {
        return *pubF;
    }
    return invalidPub;
}